

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void get_top_weights<sparse_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,sparse_parameters *weights)

{
  undefined8 *puVar1;
  uint64_t uVar2;
  vector<feature,_std::allocator<feature>_> *pvVar3;
  pointer pfVar4;
  undefined1 *puVar5;
  ulong uVar6;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> __tmp;
  _Hash_node_base *p_Var7;
  uint64_t i;
  pointer pfVar8;
  int iVar9;
  anon_class_1_0_00000001 cmp;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  anon_class_1_0_00000001 local_7d;
  float local_7c;
  vector<feature,_std::allocator<feature>_> local_78;
  pointer local_60;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  local_58;
  vector<feature,_std::allocator<feature>_> *local_38;
  
  local_60 = (pointer)(1L << ((byte)all->num_bits & 0x3f));
  local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(&local_58,&local_7d,&local_78);
  local_38 = output;
  if (local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pfVar8 = (pointer)(long)top_words_count;
  p_Var7 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (top_words_count != 0) {
    pfVar4 = local_60;
    if (pfVar8 < local_60) {
      pfVar4 = pfVar8;
    }
    puVar5 = (undefined1 *)((long)&pfVar4->x + (ulong)(pfVar4 == (pointer)0x0));
    do {
      local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)p_Var7[1]._M_nxt;
      local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)CONCAT44(local_78.super__Vector_base<feature,_std::allocator<feature>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    *(undefined4 *)
                                     ((long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)topic * 4));
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push(&local_58,(value_type *)&local_78);
      p_Var7 = p_Var7->_M_nxt;
      puVar5 = puVar5 + -1;
    } while (puVar5 != (undefined1 *)0x0);
  }
  pfVar4 = local_60;
  if (pfVar8 < local_60) {
    do {
      local_7c = *(float *)((long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)topic * 4);
      if ((local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
           super__Vector_impl_data._M_start)->x <= local_7c &&
          local_7c !=
          (local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
           super__Vector_impl_data._M_start)->x) {
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
        ::pop(&local_58);
        local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_78.super__Vector_base<feature,_std::allocator<feature>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,local_7c);
        local_78.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar8;
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
        ::push(&local_58,(value_type *)&local_78);
      }
      pfVar8 = (pointer)((long)&pfVar8->x + 1);
      p_Var7 = p_Var7->_M_nxt;
    } while (pfVar4 != pfVar8);
  }
  pvVar3 = local_38;
  std::vector<feature,_std::allocator<feature>_>::resize
            (local_38,(long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl
                            .super__Vector_impl_data._M_start >> 4);
  iVar9 = (int)((ulong)((long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) + 1;
  uVar6 = (long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff0;
  while( true ) {
    iVar9 = iVar9 + -1;
    if (iVar9 < 1) break;
    uVar2 = (local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
             super__Vector_impl_data._M_start)->weight_index;
    puVar1 = (undefined8 *)
             ((long)&(pvVar3->super__Vector_base<feature,_std::allocator<feature>_>)._M_impl.
                     super__Vector_impl_data._M_start[-1].x + uVar6);
    *puVar1 = *(undefined8 *)
               local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1[1] = uVar2;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(&local_58);
    uVar6 = uVar6 - 0x10;
  }
  if (local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.super__Vector_base<feature,_std::allocator<feature>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}